

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonBondedInteractionsSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::NonBondedInteractionsSectionParser::parseLine
          (NonBondedInteractionsSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  double dVar1;
  double dVar2;
  ForceFieldOptions *pFVar3;
  int iVar4;
  NonBondedInteractionTypeEnum NVar5;
  int myMatt;
  EAMInteractionType *this_00;
  char *__format;
  uint uVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  RealType kappa;
  RealType lambda;
  RealType RVar10;
  RealType RVar11;
  RealType RVar12;
  RealType RVar13;
  RealType RVar14;
  StringTokenizer tokenizer;
  pair<int,_double> local_f8;
  string btype;
  string at1;
  _Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_88;
  string at2;
  string itype;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&at1," ;\t\n\r",(allocator<char> *)&at2);
  StringTokenizer::StringTokenizer(&tokenizer,line,&at1);
  std::__cxx11::string::~string((string *)&at1);
  iVar4 = StringTokenizer::countTokens(&tokenizer);
  if (iVar4 < 3) {
    snprintf(painCave.errMsg,2000,
             "NonBondedInteractionsSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  pFVar3 = this->options_;
  this->meus_ = (pFVar3->MetallicEnergyUnitScaling).data_;
  this->eus_ = (pFVar3->EnergyUnitScaling).data_;
  this->dus_ = (pFVar3->DistanceUnitScaling).data_;
  StringTokenizer::nextToken_abi_cxx11_(&at1,&tokenizer);
  StringTokenizer::nextToken_abi_cxx11_(&at2,&tokenizer);
  StringTokenizer::nextToken_abi_cxx11_(&itype,&tokenizer);
  NVar5 = getNonBondedInteractionTypeEnum(this,&itype);
  __format = "NonBondedInteractionsSectionParser Error: Unknown Interaction Type at line %d\n";
  if (NVar5 < Unknown) {
    uVar6 = iVar4 - 3;
    switch(NVar5) {
    case ShiftedMorse:
      if (uVar6 != 3) {
LAB_0019672f:
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 6 tokens expected.  \n"
        ;
        goto switchD_0019628a_caseD_7;
      }
      dVar9 = this->dus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar8 = this->eus_;
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar2 = this->dus_;
      this_00 = (EAMInteractionType *)operator_new(0x80);
      MorseInteractionType::MorseInteractionType
                ((MorseInteractionType *)this_00,dVar8 * RVar11,RVar12 / dVar2,dVar9 * RVar10,
                 mtShifted);
      break;
    case LennardJones:
      if (uVar6 != 2) {
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 5 tokens expected.  \n"
        ;
        goto switchD_0019628a_caseD_7;
      }
      dVar9 = this->dus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar8 = this->eus_;
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      this_00 = (EAMInteractionType *)operator_new(0x70);
      LennardJonesInteractionType::LennardJonesInteractionType
                ((LennardJonesInteractionType *)this_00,dVar9 * RVar10,dVar8 * RVar11);
      break;
    case RepulsiveMorse:
      if (uVar6 != 3) goto LAB_0019672f;
      dVar9 = this->dus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar8 = this->eus_;
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar2 = this->dus_;
      this_00 = (EAMInteractionType *)operator_new(0x80);
      MorseInteractionType::MorseInteractionType
                ((MorseInteractionType *)this_00,dVar8 * RVar11,RVar12 / dVar2,dVar9 * RVar10,
                 mtRepulsive);
      break;
    case RepulsivePower:
      if (iVar4 < 6) goto LAB_0019672f;
      dVar9 = this->dus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar8 = this->eus_;
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      iVar4 = StringTokenizer::nextTokenAsInt(&tokenizer);
      this_00 = (EAMInteractionType *)operator_new(0x78);
      RepulsivePowerInteractionType::RepulsivePowerInteractionType
                ((RepulsivePowerInteractionType *)this_00,dVar9 * RVar10,dVar8 * RVar11,iVar4);
      break;
    case Mie:
      if (uVar6 != 4) {
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 7 tokens expected.  \n"
        ;
        goto switchD_0019628a_caseD_7;
      }
      dVar9 = this->dus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar8 = this->eus_;
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      iVar4 = StringTokenizer::nextTokenAsInt(&tokenizer);
      myMatt = StringTokenizer::nextTokenAsInt(&tokenizer);
      this_00 = (EAMInteractionType *)operator_new(0x78);
      MieInteractionType::MieInteractionType
                ((MieInteractionType *)this_00,dVar9 * RVar10,dVar8 * RVar11,iVar4,myMatt);
      break;
    case MAW:
      if (uVar6 != 5) {
LAB_00196915:
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 8 tokens expected.  \n"
        ;
        goto switchD_0019628a_caseD_7;
      }
      dVar9 = this->dus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar8 = this->eus_;
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar2 = this->dus_;
      RVar13 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar14 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      this_00 = (EAMInteractionType *)operator_new(0x88);
      MAWInteractionType::MAWInteractionType
                ((MAWInteractionType *)this_00,dVar8 * RVar11,RVar12 / dVar2,dVar9 * RVar10,RVar13,
                 RVar14);
      break;
    case Buckingham:
      __format = "NonBondedInteractionsSectionParser Error: Not enough tokens at line %d\n";
      if (iVar4 < 7) goto switchD_0019628a_caseD_7;
      StringTokenizer::nextToken_abi_cxx11_(&btype,&tokenizer);
      std::locale::locale((locale *)&local_f8);
      toUpper<std::__cxx11::string>(&btype,(locale *)&local_f8);
      std::locale::~locale((locale *)&local_f8);
      dVar9 = this->eus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar8 = RVar11 / this->dus_;
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar9 = dVar9 * RVar10;
      iVar4 = std::__cxx11::string::compare((char *)&btype);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)&btype);
        if (iVar4 == 0) {
          this_00 = (EAMInteractionType *)0x0;
          snprintf(painCave.errMsg,2000,
                   "NonBondedInteractionsSectionParser Error: Unknown Buckingham Type at line %d\n",
                   (ulong)(uint)lineNo);
          painCave.isFatal = 1;
          simError();
        }
        else {
          this_00 = (EAMInteractionType *)operator_new(0x90);
          BuckinghamInteractionType::BuckinghamInteractionType
                    ((BuckinghamInteractionType *)this_00,dVar9,dVar8,RVar11,btTraditional);
        }
      }
      else {
        dVar2 = this->dus_;
        RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        dVar1 = this->eus_;
        RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        this_00 = (EAMInteractionType *)operator_new(0x90);
        BuckinghamInteractionType::BuckinghamInteractionType
                  ((BuckinghamInteractionType *)this_00,dVar9,dVar8,RVar11,dVar2 * RVar10,
                   dVar1 * RVar12,btModified);
      }
      std::__cxx11::string::~string((string *)&btype);
      if (this_00 == (EAMInteractionType *)0x0) goto LAB_00196ad4;
      break;
    case EAMTable:
      goto switchD_0019628a_caseD_7;
    case EAMZhou:
      if (uVar6 != 7) {
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 10 tokens expected.  \n"
        ;
        goto switchD_0019628a_caseD_7;
      }
      dVar9 = this->dus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar8 = this->meus_;
      RVar13 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar2 = this->meus_;
      RVar14 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      kappa = StringTokenizer::nextTokenAsDouble(&tokenizer);
      lambda = StringTokenizer::nextTokenAsDouble(&tokenizer);
      this_00 = (EAMInteractionType *)operator_new(0xe0);
      EAMInteractionType::EAMInteractionType
                (this_00,dVar9 * RVar10,RVar11,RVar12,dVar8 * RVar13,dVar2 * RVar14,kappa,lambda);
      break;
    case EAMOxides:
      if (uVar6 != 5) goto LAB_00196915;
      dVar9 = this->dus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar11 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      dVar8 = this->meus_;
      RVar12 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar13 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      RVar14 = StringTokenizer::nextTokenAsDouble(&tokenizer);
      this_00 = (EAMInteractionType *)operator_new(0xe0);
      EAMInteractionType::EAMInteractionType
                (this_00,dVar9 * RVar10,RVar11,dVar8 * RVar12,RVar13,RVar14);
      break;
    case InversePowerSeries:
      __format = "NonBondedInteractionsSectionParser Error: Not enough tokens at line %d\n";
      if ((uVar6 & 1) != 0 || iVar4 < 5) goto switchD_0019628a_caseD_7;
      btype.field_2._M_allocated_capacity = 0;
      btype._M_dataplus._M_p = (pointer)0x0;
      btype._M_string_length = 0;
      uVar6 = uVar6 >> 1;
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
        iVar4 = StringTokenizer::nextTokenAsInt(&tokenizer);
        RVar10 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        dVar9 = this->eus_;
        local_f8.second = pow(this->dus_,(double)iVar4);
        local_f8.second = local_f8.second * RVar10 * dVar9;
        local_f8.first = iVar4;
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<std::pair<int,double>>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&btype,
                   &local_f8);
      }
      this_00 = (EAMInteractionType *)operator_new(0x90);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &local_88,
                 (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&btype)
      ;
      InversePowerSeriesInteractionType::InversePowerSeriesInteractionType
                ((InversePowerSeriesInteractionType *)this_00,
                 (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &local_88);
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base(&local_88);
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base((_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     *)&btype);
    }
    ForceField::addNonBondedInteractionType(ff,&at1,&at2,&this_00->super_NonBondedInteractionType);
  }
  else {
switchD_0019628a_caseD_7:
    snprintf(painCave.errMsg,2000,__format,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
LAB_00196ad4:
  std::__cxx11::string::~string((string *)&itype);
  std::__cxx11::string::~string((string *)&at2);
  std::__cxx11::string::~string((string *)&at1);
  StringTokenizer::~StringTokenizer(&tokenizer);
  return;
}

Assistant:

void NonBondedInteractionsSectionParser::parseLine(ForceField& ff,
                                                     const std::string& line,
                                                     int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();
    if (nTokens < 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NonBondedInteractionsSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }

    meus_ = options_.getMetallicEnergyUnitScaling();
    eus_  = options_.getEnergyUnitScaling();
    dus_  = options_.getDistanceUnitScaling();

    std::string at1   = tokenizer.nextToken();
    std::string at2   = tokenizer.nextToken();
    std::string itype = tokenizer.nextToken();

    NonBondedInteractionTypeEnum nbit = getNonBondedInteractionTypeEnum(itype);
    nTokens -= 3;
    NonBondedInteractionType* interactionType = NULL;

    // switch is a nightmare to maintain
    switch (nbit) {
    case MAW:
      if (nTokens != 5) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 8 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType r_e    = dus_ * tokenizer.nextTokenAsDouble();
        RealType D_e    = eus_ * tokenizer.nextTokenAsDouble();
        RealType beta   = tokenizer.nextTokenAsDouble() / dus_;
        RealType ca1    = tokenizer.nextTokenAsDouble();
        RealType cb1    = tokenizer.nextTokenAsDouble();
        interactionType = new MAWInteractionType(D_e, beta, r_e, ca1, cb1);
      }
      break;

    case ShiftedMorse:
      if (nTokens != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 6 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType r0     = dus_ * tokenizer.nextTokenAsDouble();
        RealType D0     = eus_ * tokenizer.nextTokenAsDouble();
        RealType beta0  = tokenizer.nextTokenAsDouble() / dus_;
        interactionType = new MorseInteractionType(D0, beta0, r0, mtShifted);
      }
      break;

    case RepulsiveMorse:
      if (nTokens != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 6 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType r0     = dus_ * tokenizer.nextTokenAsDouble();
        RealType D0     = eus_ * tokenizer.nextTokenAsDouble();
        RealType beta0  = tokenizer.nextTokenAsDouble() / dus_;
        interactionType = new MorseInteractionType(D0, beta0, r0, mtRepulsive);
      }
      break;

    case LennardJones:
      if (nTokens != 2) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 5 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType sigma   = dus_ * tokenizer.nextTokenAsDouble();
        RealType epsilon = eus_ * tokenizer.nextTokenAsDouble();
        interactionType  = new LennardJonesInteractionType(sigma, epsilon);
      }
      break;

    case RepulsivePower:
      if (nTokens < 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 6 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType sigma   = dus_ * tokenizer.nextTokenAsDouble();
        RealType epsilon = eus_ * tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        interactionType =
            new RepulsivePowerInteractionType(sigma, epsilon, nRep);
      }
      break;

    case Mie:
      if (nTokens != 4) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 7 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType sigma   = dus_ * tokenizer.nextTokenAsDouble();
        RealType epsilon = eus_ * tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        int mAtt         = tokenizer.nextTokenAsInt();
        interactionType  = new MieInteractionType(sigma, epsilon, nRep, mAtt);
      }
      break;

    case Buckingham:
      if (nTokens < 4) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Not enough tokens "
                 "at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        std::string btype = tokenizer.nextToken();
        toUpper(btype);

        RealType A = eus_ * tokenizer.nextTokenAsDouble();
        RealType B = tokenizer.nextTokenAsDouble() / dus_;
        RealType C =
            tokenizer.nextTokenAsDouble();  // should also have a scaling
        RealType sigma   = 0.0;
        RealType epsilon = 0.0;

        if (btype.compare("MODIFIED")) {
          sigma           = dus_ * tokenizer.nextTokenAsDouble();
          epsilon         = eus_ * tokenizer.nextTokenAsDouble();
          interactionType = new BuckinghamInteractionType(A, B, C, sigma,
                                                          epsilon, btModified);

        } else if (btype.compare("TRADITIONAL")) {
          interactionType =
              new BuckinghamInteractionType(A, B, C, btTraditional);
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "NonBondedInteractionsSectionParser Error: Unknown "
                   "Buckingham Type at "
                   "line %d\n",
                   lineNo);
          painCave.isFatal = 1;
          simError();
        }
      }
      break;

    case EAMZhou:
      if (nTokens != 7) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 10 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType re    = dus_ * tokenizer.nextTokenAsDouble();
        RealType alpha = tokenizer.nextTokenAsDouble();
        RealType beta  = tokenizer.nextTokenAsDouble();
        // Because EAM is a metallic potential, we'll use the metallic
        // unit scaling for these two parameters
        RealType A      = meus_ * tokenizer.nextTokenAsDouble();
        RealType B      = meus_ * tokenizer.nextTokenAsDouble();
        RealType kappa  = tokenizer.nextTokenAsDouble();
        RealType lambda = tokenizer.nextTokenAsDouble();

        interactionType =
            new EAMInteractionType(re, alpha, beta, A, B, kappa, lambda);
      }
      break;

    case EAMOxides:
      if (nTokens != 5) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 8 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType re    = dus_ * tokenizer.nextTokenAsDouble();
        RealType alpha = tokenizer.nextTokenAsDouble();
        // Because EAM is a metallic potential, we'll use the metallic
        // unit scaling for these two parameters
        RealType A  = meus_ * tokenizer.nextTokenAsDouble();
        RealType Ci = tokenizer.nextTokenAsDouble();
        RealType Cj = tokenizer.nextTokenAsDouble();

        interactionType = new EAMInteractionType(re, alpha, A, Ci, Cj);
      }
      break;

    case InversePowerSeries:
      if (nTokens < 2 || nTokens % 2 != 0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Not enough tokens "
                 "at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        std::vector<std::pair<int, RealType>> series;
        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble() * eus_ * pow(dus_, power);
          series.push_back(std::make_pair(power, coefficient));
        }
        interactionType = new InversePowerSeriesInteractionType(series);
      }
      break;

    case Unknown:
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NonBondedInteractionsSectionParser Error: Unknown Interaction "
               "Type at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();

      break;
    }

    if (interactionType != NULL) {
      ff.addNonBondedInteractionType(at1, at2, interactionType);
    }
  }